

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
phmap::priv::
keys<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,priv *this,
          node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          *s)

{
  bool bVar1;
  size_t __n;
  reference __args;
  const_iterator cVar2;
  iterator iVar3;
  value_type *v;
  const_iterator __end0;
  const_iterator __begin0;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *__range2;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *s_local;
  vector<int,_std::allocator<int>_> *res;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __n = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
        ::size((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                *)this);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  cVar2 = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          ::begin((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                   *)this);
  __end0.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)cVar2.inner_.ctrl_;
  iVar3 = (iterator)
          raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          ::end((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                 *)this);
  while( true ) {
    __end0.inner_.ctrl_ = (ctrl_t *)iVar3.field_1;
    v = (value_type *)iVar3.ctrl_;
    bVar1 = operator!=((const_iterator *)&__end0.inner_.field_1,(const_iterator *)&v);
    if (!bVar1) break;
    __args = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
             ::const_iterator::operator*((const_iterator *)&__end0.inner_.field_1);
    std::vector<int,std::allocator<int>>::emplace_back<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__args);
    raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::const_iterator::operator++((const_iterator *)&__end0.inner_.field_1);
    iVar3.field_1.slot_ = (slot_type *)__end0.inner_.ctrl_;
    iVar3.ctrl_ = (ctrl_t *)v;
  }
  return __return_storage_ptr__;
}

Assistant:

auto keys(const Set& s)
    -> std::vector<typename std::decay<typename Set::key_type>::type> {
  std::vector<typename std::decay<typename Set::key_type>::type> res;
  res.reserve(s.size());
  for (const auto& v : s) res.emplace_back(v);
  return res;
}